

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

wchar_t terminal_rebuffer_display(EditLine *el)

{
  wchar_t wVar1;
  coord_t *c;
  EditLine *el_local;
  
  terminal_free_display(el);
  (el->el_terminal).t_size.h = (el->el_terminal).t_val[3];
  (el->el_terminal).t_size.v = (el->el_terminal).t_val[2];
  wVar1 = terminal_alloc_display(el);
  if (wVar1 == L'\xffffffff') {
    el_local._4_4_ = L'\xffffffff';
  }
  else {
    el_local._4_4_ = L'\0';
  }
  return el_local._4_4_;
}

Assistant:

static int
terminal_rebuffer_display(EditLine *el)
{
	coord_t *c = &el->el_terminal.t_size;

	terminal_free_display(el);

	c->h = Val(T_co);
	c->v = Val(T_li);

	if (terminal_alloc_display(el) == -1)
		return -1;
	return 0;
}